

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O0

barindex __thiscall BmsUtil::LCM(BmsUtil *this,barindex x,barindex y)

{
  barindex bVar1;
  int x_00;
  barindex y_local;
  barindex x_local;
  
  x_00 = (int)this;
  if ((x_00 == 0) || (x == 0)) {
    y_local = 0;
  }
  else {
    bVar1 = GCD(x_00,x);
    y_local = (x_00 * x) / bVar1;
  }
  return y_local;
}

Assistant:

barindex
BmsUtil::LCM(barindex x, barindex y)
{
	if (x == 0 || y == 0) { return 0; }
	return x * y / BmsUtil::GCD(x, y);
}